

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper-api.c
# Opt level: O2

int tlv_parse_data(uint8_t *buf,size_t buflen,int argc,...)

{
  undefined8 uVar1;
  char in_AL;
  int iVar2;
  uint8_t *puVar3;
  undefined4 *puVar4;
  int *piVar5;
  long *plVar6;
  uint8_t *puVar7;
  uint64_t uVar8;
  undefined8 *puVar9;
  uint64_t *puVar10;
  uint8_t *puVar11;
  uint8_t uVar12;
  uint uVar13;
  undefined8 in_RCX;
  ulong uVar14;
  uint32_t block_size;
  int iVar15;
  name_component_t *comp;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [24];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined4 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  ulong local_88;
  uint8_t *local_80;
  size_t local_78;
  uint64_t *local_70;
  ndn_hmac_key_t *local_68;
  uint64_t *local_60;
  uint64_t *local_58;
  uint32_t local_50;
  uint local_4c;
  uint32_t block_type;
  uint32_t block_len;
  va_list vl;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Da;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  puVar3 = tlv_get_type_length(buf,buflen,&local_50,&local_4c);
  if (puVar3 == (uint8_t *)0x0) {
    iVar2 = -0xe;
  }
  else if (local_50 == 6) {
    local_80 = buf + buflen;
    if (puVar3 + local_4c == local_80) {
      iVar15 = 0;
      local_78 = buflen;
      iVar2 = ndn_data_tlv_decode_no_verify
                        (&tlv_parse_data::data,buf,(uint32_t)buflen,(uint32_t *)0x0,(uint32_t *)0x0)
      ;
      if (iVar2 == 0) {
        vl[0].overflow_arg_area = local_138;
        vl[0]._0_8_ = &stack0x00000008;
        _block_type = 0x3000000018;
        iVar2 = 0;
        local_70 = (uint64_t *)0x0;
        local_60 = (uint64_t *)0x0;
        local_58 = (uint64_t *)0x0;
        local_68 = (ndn_hmac_key_t *)0x0;
        local_88 = 0;
        for (; (puVar7 = local_80, uVar1 = tlv_parse_data::data.metainfo.final_block_id._36_8_,
               iVar2 == 0 && (iVar15 < argc)); iVar15 = iVar15 + 1) {
          uVar14 = _block_type & 0xffffffff;
          if (uVar14 < 0x29) {
            puVar4 = (undefined4 *)(uVar14 + (long)vl[0].overflow_arg_area);
            uVar14 = (ulong)(block_type + 8);
            _block_type = CONCAT44(block_len,block_type + 8);
          }
          else {
            puVar4 = (undefined4 *)vl[0]._0_8_;
            vl[0]._0_8_ = vl[0]._0_8_ + 8;
          }
          uVar13 = (uint)uVar14;
          switch(*puVar4) {
          case 0:
            if (uVar13 < 0x29) {
              _block_type = CONCAT44(block_len,uVar13 + 8);
              puVar9 = (undefined8 *)(uVar14 + (long)vl[0].overflow_arg_area);
            }
            else {
              puVar9 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            if ((void *)*puVar9 != (void *)0x0) {
              memcpy((void *)*puVar9,&tlv_parse_data::data,0x1bc);
              break;
            }
            goto LAB_0010e5b2;
          case 1:
            if (uVar13 < 0x29) {
              _block_type = CONCAT44(block_len,uVar13 + 8);
              puVar9 = (undefined8 *)(uVar14 + (long)vl[0].overflow_arg_area);
            }
            else {
              puVar9 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            puVar10 = (uint64_t *)*puVar9;
            local_70 = puVar10;
            if (puVar10 == (uint64_t *)0x0) {
              iVar2 = -0x10;
              local_70 = (uint64_t *)0x0;
              goto LAB_0010e5d6;
            }
            goto LAB_0010e5cf;
          case 2:
            if (uVar13 < 0x29) {
              _block_type = CONCAT44(block_len,uVar13 + 8);
              puVar9 = (undefined8 *)(uVar14 + (long)vl[0].overflow_arg_area);
            }
            else {
              puVar9 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            puVar10 = (uint64_t *)*puVar9;
            if (puVar10 == (uint64_t *)0x0) goto LAB_0010e5b2;
            if (tlv_parse_data::data.name.components_size != 0) {
              comp = tlv_parse_data::data.name.components +
                     (tlv_parse_data::data.name.components_size - 1);
LAB_0010e57e:
              uVar8 = tlv_decode_segno(comp);
              *puVar10 = uVar8;
              break;
            }
            iVar2 = -0x11;
            goto LAB_0010e5d6;
          case 3:
            if (uVar13 < 0x29) {
              _block_type = CONCAT44(block_len,uVar13 + 8);
              puVar9 = (undefined8 *)(uVar14 + (long)vl[0].overflow_arg_area);
            }
            else {
              puVar9 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            puVar7 = (uint8_t *)*puVar9;
            if (puVar7 == (uint8_t *)0x0) goto LAB_0010e5b2;
            uVar12 = tlv_parse_data::data.metainfo.content_type;
            if (tlv_parse_data::data.metainfo.enable_ContentType != '\0') goto LAB_0010e4d6;
            *puVar7 = 0xff;
            break;
          case 4:
            if (uVar13 < 0x29) {
              _block_type = CONCAT44(block_len,uVar13 + 8);
              puVar9 = (undefined8 *)(uVar14 + (long)vl[0].overflow_arg_area);
            }
            else {
              puVar9 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            puVar10 = (uint64_t *)*puVar9;
            uVar12 = tlv_parse_data::data.metainfo.enable_FreshnessPeriod;
            uVar8 = tlv_parse_data::data.metainfo.freshness_period;
            goto joined_r0x0010e3f1;
          case 5:
            if (uVar13 < 0x29) {
              _block_type = CONCAT44(block_len,uVar13 + 8);
              plVar6 = (long *)(uVar14 + (long)vl[0].overflow_arg_area);
            }
            else {
              plVar6 = (long *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            puVar9 = (undefined8 *)*plVar6;
            if (puVar9 == (undefined8 *)0x0) goto LAB_0010e5b2;
            if (tlv_parse_data::data.metainfo.enable_FinalBlockId == '\0') {
              *(undefined1 *)(puVar9 + 5) = 0;
            }
            else {
              *(ulong *)((long)puVar9 + 0x1c) =
                   CONCAT44(tlv_parse_data::data.metainfo.final_block_id.value._28_4_,
                            tlv_parse_data::data.metainfo.final_block_id.value._24_4_);
              *(undefined8 *)((long)puVar9 + 0x24) = uVar1;
              uVar1 = CONCAT44(tlv_parse_data::data.metainfo.final_block_id.value._24_4_,
                               tlv_parse_data::data.metainfo.final_block_id.value._20_4_);
              puVar9[2] = tlv_parse_data::data.metainfo.final_block_id.value._12_8_;
              puVar9[3] = uVar1;
              uVar1 = tlv_parse_data::data.metainfo.final_block_id.value._4_8_;
              *puVar9 = tlv_parse_data::data.metainfo.final_block_id._0_8_;
              puVar9[1] = uVar1;
            }
            break;
          case 6:
            if (uVar13 < 0x29) {
              _block_type = CONCAT44(block_len,uVar13 + 8);
              puVar9 = (undefined8 *)(uVar14 + (long)vl[0].overflow_arg_area);
            }
            else {
              puVar9 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            puVar10 = (uint64_t *)*puVar9;
            local_60 = puVar10;
            if (puVar10 != (uint64_t *)0x0) goto LAB_0010e5cf;
            iVar2 = -0x10;
            local_60 = (uint64_t *)0x0;
            goto LAB_0010e5d6;
          case 7:
            if (uVar13 < 0x29) {
              _block_type = CONCAT44(block_len,uVar13 + 8);
              puVar9 = (undefined8 *)(uVar14 + (long)vl[0].overflow_arg_area);
            }
            else {
              puVar9 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            puVar10 = (uint64_t *)*puVar9;
            if (puVar10 == (uint64_t *)0x0) goto LAB_0010e5b2;
            if (tlv_parse_data::data.metainfo.enable_FinalBlockId != '\0') {
              comp = &tlv_parse_data::data.metainfo.final_block_id;
              goto LAB_0010e57e;
            }
            *puVar10 = 0xffffffffffffffff;
            break;
          case 8:
            if (uVar13 < 0x29) {
              _block_type = CONCAT44(block_len,uVar13 + 8);
              puVar9 = (undefined8 *)(uVar14 + (long)vl[0].overflow_arg_area);
            }
            else {
              puVar9 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            puVar10 = (uint64_t *)*puVar9;
            local_58 = puVar10;
            if (puVar10 != (uint64_t *)0x0) goto LAB_0010e5cf;
            iVar2 = -0x10;
            local_58 = (uint64_t *)0x0;
            goto LAB_0010e5d6;
          case 9:
            if (uVar13 < 0x29) {
              _block_type = CONCAT44(block_len,uVar13 + 8);
              puVar9 = (undefined8 *)(uVar14 + (long)vl[0].overflow_arg_area);
            }
            else {
              puVar9 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            puVar10 = (uint64_t *)*puVar9;
            if (puVar10 == (uint64_t *)0x0) goto LAB_0010e5b2;
            uVar8 = (uint64_t)tlv_parse_data::data.content_size;
            goto LAB_0010e5ad;
          case 10:
            if (uVar13 < 0x29) {
              _block_type = CONCAT44(block_len,uVar13 + 8);
              puVar9 = (undefined8 *)(uVar14 + (long)vl[0].overflow_arg_area);
            }
            else {
              puVar9 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            puVar7 = (uint8_t *)*puVar9;
            uVar12 = tlv_parse_data::data.signature.sig_type;
            if (puVar7 == (uint8_t *)0x0) goto LAB_0010e5b2;
LAB_0010e4d6:
            *puVar7 = uVar12;
            break;
          default:
            iVar2 = -0x12;
            goto LAB_0010e5d6;
          case 0xc:
            if (uVar13 < 0x29) {
              _block_type = CONCAT44(block_len,uVar13 + 8);
              puVar9 = (undefined8 *)(uVar14 + (long)vl[0].overflow_arg_area);
            }
            else {
              puVar9 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            local_68 = (ndn_hmac_key_t *)*puVar9;
            break;
          case 0xd:
            if (uVar13 < 0x29) {
              _block_type = CONCAT44(block_len,uVar13 + 8);
              puVar9 = (undefined8 *)(uVar14 + (long)vl[0].overflow_arg_area);
            }
            else {
              puVar9 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            puVar10 = (uint64_t *)*puVar9;
            uVar12 = tlv_parse_data::data.signature.enable_Timestamp;
            uVar8 = tlv_parse_data::data.signature.timestamp;
joined_r0x0010e3f1:
            if (puVar10 != (uint64_t *)0x0) {
              if (uVar12 == '\0') {
LAB_0010e5cf:
                *puVar10 = 0;
              }
              else {
LAB_0010e5ad:
                *puVar10 = uVar8;
              }
              break;
            }
LAB_0010e5b2:
            iVar2 = -0x10;
            goto LAB_0010e5d6;
          case 0xe:
            if (uVar13 < 0x29) {
              _block_type = CONCAT44(block_len,uVar13 + 8);
              piVar5 = (int *)(uVar14 + (long)vl[0].overflow_arg_area);
            }
            else {
              piVar5 = (int *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            local_88 = CONCAT71((int7)((ulong)piVar5 >> 8),*piVar5 != 0);
          }
          iVar2 = 0;
LAB_0010e5d6:
        }
        if (iVar2 == 0) {
          puVar11 = tlv_get_type_length(puVar3,(long)local_80 - (long)puVar3,&local_50,&local_4c);
          iVar2 = -0x11;
          if (local_50 == 7) {
            if (local_70 != (uint64_t *)0x0) {
              *local_70 = (uint64_t)puVar3;
            }
            puVar11 = puVar11 + local_4c;
            if ((tlv_parse_data::data.metainfo.enable_FinalBlockId != '\0') &&
               (local_60 != (uint64_t *)0x0)) {
              puVar3 = tlv_get_type_length(puVar11,(long)puVar7 - (long)puVar11,&local_50,&local_4c)
              ;
              puVar7 = local_80;
              if (local_50 != 0x14) {
                return -0x11;
              }
              puVar11 = puVar3 + local_4c;
              for (; puVar3 < puVar11; puVar3 = puVar3 + local_4c) {
                puVar3 = tlv_get_type_length(puVar3,(long)puVar7 - (long)puVar3,&local_50,&local_4c)
                ;
                if (local_50 == 0x1a) {
                  *local_60 = (uint64_t)puVar3;
                }
              }
            }
            if ((local_58 != (uint64_t *)0x0) && (tlv_parse_data::data.content_size != 0)) {
              do {
                puVar3 = tlv_get_type_length(puVar11,(long)puVar7 - (long)puVar11,&local_50,
                                             &local_4c);
                if (local_50 == 0x15) break;
                puVar11 = puVar3 + local_4c;
              } while (puVar11 < puVar7);
              *local_58 = (uint64_t)puVar3;
            }
            iVar2 = 0;
            if ((local_88 & 1) != 0) {
              block_size = (uint32_t)local_78;
              if (tlv_parse_data::data.signature.sig_type == '\x04') {
                if (local_68 != (ndn_hmac_key_t *)0x0) {
                  iVar2 = ndn_data_tlv_decode_hmac_verify
                                    (&tlv_parse_data::data,buf,block_size,local_68);
                  return iVar2;
                }
              }
              else {
                if (tlv_parse_data::data.signature.sig_type != '\x03') {
                  if (tlv_parse_data::data.signature.sig_type == '\0') {
                    iVar2 = ndn_data_tlv_decode_digest_verify(&tlv_parse_data::data,buf,block_size);
                    return iVar2;
                  }
                  return -0x1a;
                }
                if (local_68 != (ndn_hmac_key_t *)0x0) {
                  iVar2 = ndn_data_tlv_decode_ecdsa_verify
                                    (&tlv_parse_data::data,buf,block_size,(ndn_ecc_pub_t *)local_68)
                  ;
                  return iVar2;
                }
              }
              iVar2 = -0x10;
            }
          }
        }
      }
    }
    else {
      iVar2 = -0xd;
    }
  }
  else {
    iVar2 = -0xc;
  }
  return iVar2;
}

Assistant:

int
tlv_parse_data(uint8_t* buf, size_t buflen, int argc, ...)
{
  static ndn_data_t data;
  va_list vl;
  int i, ret = NDN_SUCCESS;
  enum TLV_DATAARG_TYPE argtype;
  uint32_t block_type, block_len;
  uint8_t *ptr, *valptr, *end = buf + buflen;
  uint8_t **namebuf_ptr = NULL;
  uint8_t **finalblockid_ptr = NULL;
  uint8_t **content_ptr = NULL;
  void *arg_ptr = NULL;
  void *key_ptr = NULL;
  bool verify_sig = false;

  // Check type and length
  ptr = tlv_get_type_length(buf, buflen, &block_type, &block_len);
  if (ptr == NULL) {
    return NDN_OVERSIZE_VAR;
  }
  if (block_type != TLV_Data) {
    return NDN_WRONG_TLV_TYPE;
  }
  if (ptr + block_len != end) {
    return NDN_WRONG_TLV_LENGTH;
  }

  // Decode data
  ret = ndn_data_tlv_decode_no_verify(&data, buf, buflen, NULL, NULL);
  if (ret != NDN_SUCCESS) {
    return ret;
  }

  // Parse args
  va_start(vl, argc);
  for(i = 0; i < argc && ret == NDN_SUCCESS; i ++) {
    argtype = va_arg(vl, int);
    switch(argtype) {
      case TLV_DATAARG_NAME_PTR:
        arg_ptr = va_arg(vl, ndn_name_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(ndn_name_t*)arg_ptr = data.name;
        break;

      case TLV_DATAARG_NAME_BUF:
        namebuf_ptr = va_arg(vl, uint8_t**);
        if (namebuf_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *namebuf_ptr = NULL;
        break;

      case TLV_DATAARG_NAME_SEGNO_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.name.components_size > 0) {
          *(uint64_t*)arg_ptr = tlv_decode_segno(&data.name.components[data.name.components_size - 1]);
        }
        else {
          ret = NDN_UNSUPPORTED_FORMAT;
        }
        break;

      case TLV_DATAARG_CONTENTTYPE_U8:
        arg_ptr = va_arg(vl, uint8_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_ContentType) {
          *(uint8_t*)arg_ptr = data.metainfo.content_type;
        }
        else {
          *(uint8_t*)arg_ptr = 0xFF;
        }
        break;

      case TLV_DATAARG_FRESHNESSPERIOD_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_FreshnessPeriod) {
          *(uint64_t*)arg_ptr = data.metainfo.freshness_period;
        }
        else {
          *(uint64_t*)arg_ptr = 0;
        }
        break;

      case TLV_DATAARG_FINALBLOCKID_PTR:
        arg_ptr = va_arg(vl, name_component_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_FinalBlockId) {
          *(name_component_t*)arg_ptr = data.metainfo.final_block_id;
        }
        else {
          ((name_component_t*)arg_ptr)->size = 0;
        }
        break;

      case TLV_DATAARG_FINALBLOCKID_BUF:
        finalblockid_ptr = va_arg(vl, uint8_t**);
        if (finalblockid_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *finalblockid_ptr = NULL;
        break;

      case TLV_DATAARG_FINALBLOCKID_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_FinalBlockId) {
          *(uint64_t*)arg_ptr = tlv_decode_segno(&data.metainfo.final_block_id);
        }
        else {
          *(uint64_t*)arg_ptr = (uint64_t)-1;
        }
        break;

      case TLV_DATAARG_CONTENT_BUF:
        content_ptr = va_arg(vl, uint8_t**);
        if (content_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *content_ptr = NULL;
        break;

      case TLV_DATAARG_CONTENT_SIZE:
        arg_ptr = va_arg(vl, size_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(size_t*)arg_ptr = (size_t)data.content_size;
        break;

      case TLV_DATAARG_SIGTYPE_U8:
        arg_ptr = va_arg(vl, uint8_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(uint8_t*)arg_ptr = data.signature.sig_type;
        break;

      case TLV_DATAARG_SIGKEY_PTR:
        key_ptr = va_arg(vl, void*);
        break;

      case TLV_DATAARG_SIGTIME_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else if (data.signature.enable_Timestamp) {
          *(uint64_t*)arg_ptr = data.signature.timestamp;
        }
        else {
          *(uint64_t*)arg_ptr = 0;
        }
        break;

      case TLV_DATAARG_VERIFY:
        verify_sig = va_arg(vl, uint32_t);
        break;

      default:
        ret = NDN_INVALID_ARG;
        break;
    }
  }
  va_end(vl);
  if (ret != NDN_SUCCESS) {
    return ret;
  }

  // Decode Name (No need to check for NULL since decoding succeeded)
  valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
  if (block_type != TLV_Name) {
    return NDN_UNSUPPORTED_FORMAT;
  }
  if (namebuf_ptr != NULL) {
    *namebuf_ptr = ptr;
  }
  ptr = valptr + block_len;

  // Metainfo if applicable
  if (data.metainfo.enable_FinalBlockId && finalblockid_ptr != NULL) {
    valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
    if (block_type != TLV_MetaInfo) {
      return NDN_UNSUPPORTED_FORMAT;
    }
    ptr = valptr + block_len;

    while(valptr < ptr) {
      valptr = tlv_get_type_length(valptr, end - valptr, &block_type, &block_len);
      if (block_type == TLV_FinalBlockId) {
        *finalblockid_ptr = valptr;
      }
      valptr += block_len;
    }
  }

  // Content if applicable
  if (content_ptr && data.content_size > 0) {
    do{
      valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
      ptr = valptr + block_len;
    }while(block_type != TLV_Content && ptr < end);
    *content_ptr = valptr;
  }

  // Verify if required
  if (verify_sig) {
    switch(data.signature.sig_type) {
      case NDN_SIG_TYPE_DIGEST_SHA256:
        ret = ndn_data_tlv_decode_digest_verify(&data, buf, buflen);
        break;

      case NDN_SIG_TYPE_ECDSA_SHA256:
        if (key_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else {
          ret = ndn_data_tlv_decode_ecdsa_verify(&data, buf, buflen, (ndn_ecc_pub_t*)key_ptr);
        }
        break;

      case NDN_SIG_TYPE_HMAC_SHA256:
        if (key_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else {
          ret = ndn_data_tlv_decode_hmac_verify(&data, buf, buflen, (ndn_hmac_key_t*)key_ptr);
        }
        break;

      default:
        ret = NDN_SEC_UNSUPPORT_SIGN_TYPE;
        break;
    }
  }

  return ret;
}